

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

MockSpec<void_(SDL_Window_*)> * __thiscall
testing::internal::FunctionMocker<void_(SDL_Window_*)>::With
          (MockSpec<void_(SDL_Window_*)> *__return_storage_ptr__,
          FunctionMocker<void_(SDL_Window_*)> *this,Matcher<SDL_Window_*> *m)

{
  MatcherBase<SDL_Window_*> local_20;
  
  local_20.vtable_ = (m->super_MatcherBase<SDL_Window_*>).vtable_;
  local_20.buffer_ = (m->super_MatcherBase<SDL_Window_*>).buffer_;
  (m->super_MatcherBase<SDL_Window_*>).vtable_ = (VTable *)0x0;
  local_20.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f8ff8;
  __return_storage_ptr__->function_mocker_ = this;
  Matcher<SDL_Window_*>::Matcher
            ((Matcher<SDL_Window_*> *)&__return_storage_ptr__->matchers_,
             (Matcher<SDL_Window_*> *)&local_20);
  MatcherBase<SDL_Window_*>::~MatcherBase(&local_20);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }